

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

string * cmdline::detail::readable_typename<unsigned_long>(void)

{
  char *__s;
  string *ret;
  string *in_RDI;
  int status;
  allocator<char> local_36;
  allocator<char> local_35;
  undefined4 local_34;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,std::ctype<char>::id + (*std::ctype<char>::id == '*'),&local_36);
  local_34 = 0;
  __s = (char *)__cxa_demangle(local_30[0],0,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_35);
  free(__s);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string readable_typename() {
    return demangle(typeid(T).name());
}